

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O1

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  size_type sVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer s;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RepositoryStruct Repo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string local_150;
  string local_130;
  value_type local_110;
  vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_IFW_PACKAGE_NAME","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_PACKAGE_NAME","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
      operator_delete(local_110.Url._M_dataplus._M_p,
                      CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                               local_110.Url.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = (char *)(this->Name)._M_string_length;
    if (pcVar3 != (char *)0x0) goto LAB_002691c1;
    pcVar3 = "Your package";
  }
  else {
    pcVar7 = (char *)(this->Name)._M_string_length;
LAB_002691c1:
    strlen(pcVar3);
  }
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar7,(ulong)pcVar3);
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_IFW_PACKAGE_TITLE","")
  ;
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"CPACK_PACKAGE_DESCRIPTION_SUMMARY","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
      operator_delete(local_110.Url._M_dataplus._M_p,
                      CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                               local_110.Url.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = (char *)(this->Title)._M_string_length;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "Your package description";
    }
    else {
      strlen(pcVar3);
    }
  }
  else {
    pcVar7 = (char *)(this->Title)._M_string_length;
    strlen(pcVar3);
  }
  std::__cxx11::string::_M_replace((ulong)&this->Title,0,pcVar7,(ulong)pcVar3);
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_PACKAGE_VERSION","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  pcVar7 = (char *)(this->Version)._M_string_length;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "1.0.0";
  }
  else {
    strlen(pcVar3);
  }
  std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar7,(ulong)pcVar3);
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CPACK_IFW_PACKAGE_PUBLISHER","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_PACKAGE_VENDOR","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
      operator_delete(local_110.Url._M_dataplus._M_p,
                      CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                               local_110.Url.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar3 != (char *)0x0) goto LAB_00269475;
  }
  else {
LAB_00269475:
    pcVar7 = (char *)(this->Publisher)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->Publisher,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_IFW_PRODUCT_URL","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->ProductUrl)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->ProductUrl,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_IFW_PACKAGE_ICON","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if ((pcVar3 != (char *)0x0) && (bVar2 = cmsys::SystemTools::FileExists(pcVar3), bVar2)) {
    pcVar7 = (char *)(this->InstallerApplicationIcon)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->InstallerApplicationIcon,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CPACK_IFW_PACKAGE_WINDOW_ICON","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if ((pcVar3 != (char *)0x0) && (bVar2 = cmsys::SystemTools::FileExists(pcVar3), bVar2)) {
    pcVar7 = (char *)(this->InstallerWindowIcon)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->InstallerWindowIcon,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CPACK_IFW_PACKAGE_LOGO","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if ((pcVar3 != (char *)0x0) && (bVar2 = cmsys::SystemTools::FileExists(pcVar3), bVar2)) {
    pcVar7 = (char *)(this->Logo)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->Logo,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->StartMenuDir);
  }
  else {
    pcVar7 = (char *)(this->StartMenuDir)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->StartMenuDir,0,pcVar7,(ulong)pcVar3);
  }
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CPACK_IFW_TARGET_DIRECTORY","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"CPACK_PACKAGE_INSTALL_DIRECTORY","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
      operator_delete(local_110.Url._M_dataplus._M_p,
                      CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                               local_110.Url.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = (char *)(this->TargetDir)._M_string_length;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&this->TargetDir,0,pcVar7,0x50035c);
      std::__cxx11::string::append((char *)&this->TargetDir);
      goto LAB_002698d1;
    }
    pcVar3 = "@RootDir@/usr/local";
  }
  else {
    pcVar7 = (char *)(this->TargetDir)._M_string_length;
    strlen(pcVar3);
  }
  std::__cxx11::string::_M_replace((ulong)&this->TargetDir,0,pcVar7,(ulong)pcVar3);
LAB_002698d1:
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CPACK_IFW_ADMIN_TARGET_DIRECTORY","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_110.Url);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->AdminTargetDir)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->AdminTargetDir,0,pcVar7,(ulong)pcVar3);
  }
  local_70 = &this->Repositories;
  std::
  vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
  ::_M_erase_at_end(local_70,(this->Repositories).
                             super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_110.Enabled._M_dataplus._M_p = (pointer)&local_110.Enabled.field_2;
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  local_110.Url._M_string_length = 0;
  local_110.Url.field_2._M_local_buf[0] = '\0';
  local_110.Enabled._M_string_length = 0;
  local_110.Enabled.field_2._M_local_buf[0] = '\0';
  local_110.Username._M_dataplus._M_p = (pointer)&local_110.Username.field_2;
  local_110.Username._M_string_length = 0;
  local_110.Username.field_2._M_local_buf[0] = '\0';
  local_110.Password._M_dataplus._M_p = (pointer)&local_110.Password.field_2;
  local_110.Password._M_string_length = 0;
  local_110.Password.field_2._M_local_buf[0] = '\0';
  local_110.DisplayName._M_dataplus._M_p = (pointer)&local_110.DisplayName.field_2;
  local_110.DisplayName._M_string_length = 0;
  local_110.DisplayName.field_2._M_local_buf[0] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"CPACK_DOWNLOAD_SITE","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  sVar1 = local_110.Url._M_string_length;
  if (pcVar3 != (char *)0x0) {
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar1,(ulong)pcVar3);
    std::
    vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
    ::push_back(local_70,&local_110);
  }
  paVar8 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_REPOSITORIES_ALL","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150._M_dataplus._M_p = (pointer)paVar8;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,pcVar3,pcVar3 + sVar4);
    cmSystemTools::ExpandListArgument(&local_150,&local_68,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar8 = &local_130.field_2;
      s = local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::UpperCase(&local_50,s);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x5003d3);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_130.field_2._M_allocated_capacity = *psVar6;
          local_130.field_2._8_8_ = plVar5[3];
          local_130._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar6;
          local_130._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_150.field_2._M_allocated_capacity = *psVar6;
          local_150.field_2._8_8_ = plVar5[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar6;
          local_150._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_150._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_130._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        if (this->Generator == (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar1 = local_110.Url._M_string_length;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        else {
          strlen(pcVar3);
        }
        std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar1,(ulong)pcVar3);
        local_130._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        if (this->Generator == (cmCPackIFWGenerator *)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = cmCPackGenerator::IsOn(&this->Generator->super_cmCPackGenerator,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = "";
        if (bVar2 != false) {
          pcVar3 = "0";
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_110.Enabled,0,(char *)local_110.Enabled._M_string_length,
                   (ulong)pcVar3);
        local_130._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        if (this->Generator == (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar1 = local_110.Username._M_string_length;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        else {
          strlen(pcVar3);
        }
        std::__cxx11::string::_M_replace((ulong)&local_110.Username,0,(char *)sVar1,(ulong)pcVar3);
        local_130._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        if (this->Generator == (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar1 = local_110.Password._M_string_length;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        else {
          strlen(pcVar3);
        }
        std::__cxx11::string::_M_replace((ulong)&local_110.Password,0,(char *)sVar1,(ulong)pcVar3);
        local_130._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150._M_dataplus._M_p,
                   local_150._M_dataplus._M_p + local_150._M_string_length);
        std::__cxx11::string::append((char *)&local_130);
        if (this->Generator == (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar8) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar1 = local_110.DisplayName._M_string_length;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "";
        }
        else {
          strlen(pcVar3);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_110.DisplayName,0,(char *)sVar1,(ulong)pcVar3);
        if ((char *)local_110.Url._M_string_length != (char *)0x0) {
          std::
          vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
          ::push_back(local_70,&local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        s = s + 1;
      } while (s != local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->MaintenanceToolName)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->MaintenanceToolName,0,pcVar7,(ulong)pcVar3);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->MaintenanceToolIniFile)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->MaintenanceToolIniFile,0,pcVar7,(ulong)pcVar3);
  }
  paVar8 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    local_150._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = cmCPackGenerator::IsOn(&this->Generator->super_cmCPackGenerator,&local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar8) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = "false";
    if (bVar2 != false) {
      pcVar3 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->AllowNonAsciiCharacters,0,
               (char *)(this->AllowNonAsciiCharacters)._M_string_length,(ulong)pcVar3);
  }
  local_150._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    local_150._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = cmCPackGenerator::IsOn(&this->Generator->super_cmCPackGenerator,&local_150);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar8) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = "false";
    if (bVar2 != false) {
      pcVar3 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->AllowSpaceInPath,0,(char *)(this->AllowSpaceInPath)._M_string_length,
               (ulong)pcVar3);
  }
  local_150._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT","");
  if (this->Generator == (cmCPackIFWGenerator *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->ControlScript)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->ControlScript,0,pcVar7,(ulong)pcVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.DisplayName._M_dataplus._M_p != &local_110.DisplayName.field_2) {
    operator_delete(local_110.DisplayName._M_dataplus._M_p,
                    CONCAT71(local_110.DisplayName.field_2._M_allocated_capacity._1_7_,
                             local_110.DisplayName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Password._M_dataplus._M_p != &local_110.Password.field_2) {
    operator_delete(local_110.Password._M_dataplus._M_p,
                    CONCAT71(local_110.Password.field_2._M_allocated_capacity._1_7_,
                             local_110.Password.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Username._M_dataplus._M_p != &local_110.Username.field_2) {
    operator_delete(local_110.Username._M_dataplus._M_p,
                    CONCAT71(local_110.Username.field_2._M_allocated_capacity._1_7_,
                             local_110.Username.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Enabled._M_dataplus._M_p != &local_110.Enabled.field_2) {
    operator_delete(local_110.Enabled._M_dataplus._M_p,
                    CONCAT71(local_110.Enabled.field_2._M_allocated_capacity._1_7_,
                             local_110.Enabled.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Url._M_dataplus._M_p != &local_110.Url.field_2) {
    operator_delete(local_110.Url._M_dataplus._M_p,
                    CONCAT71(local_110.Url.field_2._M_allocated_capacity._1_7_,
                             local_110.Url.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
      this->GetOption("CPACK_IFW_PACKAGE_NAME"))
    {
    Name = optIFW_PACKAGE_NAME;
    }
  else if (const char* optPACKAGE_NAME =
           this->GetOption("CPACK_PACKAGE_NAME"))
    {
    Name = optPACKAGE_NAME;
    }
  else
    {
    Name = "Your package";
    }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
      GetOption("CPACK_IFW_PACKAGE_TITLE"))
    {
    Title = optIFW_PACKAGE_TITLE;
    }
  else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
           GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY"))
    {
    Title = optPACKAGE_DESCRIPTION_SUMMARY;
    }
  else
    {
    Title = "Your package description";
    }

  // Version;
  if (const char* option = GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = option;
    }
  else
    {
    Version = "1.0.0";
    }

  // Publisher
  if(const char* optIFW_PACKAGE_PUBLISHER =
     GetOption("CPACK_IFW_PACKAGE_PUBLISHER"))
    {
    Publisher = optIFW_PACKAGE_PUBLISHER;
    }
  else if(const char* optPACKAGE_VENDOR = GetOption("CPACK_PACKAGE_VENDOR"))
    {
    Publisher = optPACKAGE_VENDOR;
    }

  // ProductUrl
  if(const char* option = GetOption("CPACK_IFW_PRODUCT_URL"))
    {
    ProductUrl = option;
    }

  // ApplicationIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerApplicationIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // WindowIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerWindowIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Logo
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_LOGO"))
    {
    if(cmSystemTools::FileExists(option))
      {
      Logo = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
      this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY"))
    {
    StartMenuDir = optIFW_START_MENU_DIR;
    }
  else
    {
    StartMenuDir = Name;
    }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
      GetOption("CPACK_IFW_TARGET_DIRECTORY"))
    {
    TargetDir = optIFW_TARGET_DIRECTORY;
    }
  else if (const char *optPACKAGE_INSTALL_DIRECTORY =
           GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY"))
    {
    TargetDir = "@ApplicationsDir@/";
    TargetDir += optPACKAGE_INSTALL_DIRECTORY;
    }
  else
    {
    TargetDir = "@RootDir@/usr/local";
    }

  // Default target directory for installation with administrator rights
  if (const char* option = GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY"))
    {
    AdminTargetDir = option;
    }

  // Repositories
  Repositories.clear();
  RepositoryStruct Repo;
  if(const char *site = this->GetOption("CPACK_DOWNLOAD_SITE"))
    {
    Repo.Url = site;
    Repositories.push_back(Repo);
    }
  if(const char *RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL"))
    {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr,
                                      RepoAllVector);
    for(std::vector<std::string>::iterator
          rit = RepoAllVector.begin(); rit != RepoAllVector.end(); ++rit)
      {
        std::string prefix = "CPACK_IFW_REPOSITORY_"
          + cmsys::SystemTools::UpperCase(*rit)
          + "_";
        // Url
        if (const char* url = GetOption(prefix + "URL"))
          {
          Repo.Url = url;
          }
        else
          {
          Repo.Url = "";
          }
        // Enabled
        if (IsOn(prefix + "DISABLED"))
          {
          Repo.Enabled = "0";
          }
        else
          {
          Repo.Enabled = "";
          }
        // Username
        if (const char* username = GetOption(prefix + "USERNAME"))
          {
          Repo.Username = username;
          }
        else
          {
          Repo.Username = "";
          }
        // Password
        if (const char* password = GetOption(prefix + "PASSWORD"))
          {
          Repo.Password = password;
          }
        else
          {
          Repo.Password = "";
          }
        // DisplayName
        if (const char* displayName = GetOption(prefix + "DISPLAY_NAME"))
          {
          Repo.DisplayName = displayName;
          }
        else
          {
          Repo.DisplayName = "";
          }

        if(!Repo.Url.empty())
          {
          Repositories.push_back(Repo);
          }
      }
    }

  // Maintenance tool
  if(const char* optIFW_MAINTENANCE_TOOL =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME"))
    {
    MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
    }

  // Maintenance tool ini file
  if(const char* optIFW_MAINTENANCE_TOOL_INI =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE"))
    {
    MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
    }

  // Allow non-ASCII characters
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
      {
      AllowNonAsciiCharacters = "true";
      }
    else
      {
      AllowNonAsciiCharacters = "false";
      }
    }

  // Space in path
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
      {
      AllowSpaceInPath = "true";
      }
    else
      {
      AllowSpaceInPath = "false";
      }
    }

  // Control script
  if(const char* optIFW_CONTROL_SCRIPT =
      this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT"))
    {
    ControlScript = optIFW_CONTROL_SCRIPT;
    }
}